

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O2

gdImagePtr gdImageCreateFromTgaCtx(gdIOCtx *ctx)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  oTga *tga;
  gdImagePtr im;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  gdImagePtr image;
  
  tga = (oTga *)gdMalloc(0x38);
  if (tga != (oTga *)0x0) {
    tga->ident = (char *)0x0;
    tga->bitmap = (int *)0x0;
    iVar3 = read_header_tga(ctx,tga);
    if (((-1 < iVar3) && (iVar3 = read_image_tga(ctx,tga), -1 < iVar3)) &&
       (im = gdImageCreateTrueColor(tga->width,tga->height), im != (gdImagePtr)0x0)) {
      if (tga->alphabits != '\0') {
        gdImageAlphaBlending(im,0);
        gdImageSaveAlpha(im,1);
      }
      lVar4 = 0;
      iVar3 = 0;
      do {
        if (tga->height <= lVar4) {
          if (tga->flipv == '\0') {
            if (tga->fliph != '\0') {
              gdImageFlipHorizontal(im);
            }
          }
          else if (tga->fliph == '\0') {
            gdImageFlipVertical(im);
          }
          else {
            gdImageFlipBoth(im);
          }
          free_tga(tga);
          return im;
        }
        piVar1 = im->tpixels[lVar4];
        for (lVar5 = 0; (int)lVar5 < tga->width; lVar5 = lVar5 + 1) {
          if (tga->bits == ' ') {
            if (tga->alphabits != '\0') {
              piVar2 = tga->bitmap;
              iVar7 = piVar2[iVar3] +
                      piVar2[(long)iVar3 + 1] * 0x100 +
                      piVar2[(long)iVar3 + 2] * 0x10000 +
                      (piVar2[(long)iVar3 + 3] & 0xfffffffeU) * -0x800000 + 0x7f000000;
              iVar6 = 4;
              goto LAB_0011d39a;
            }
          }
          else if (tga->bits == '\x18') {
            piVar2 = tga->bitmap;
            iVar7 = piVar2[(long)iVar3 + 1] * 0x100 + piVar2[(long)iVar3 + 2] * 0x10000 +
                    piVar2[iVar3];
            iVar6 = 3;
LAB_0011d39a:
            piVar1[lVar5] = iVar7;
            iVar3 = iVar3 + iVar6;
          }
        }
        lVar4 = lVar4 + 1;
      } while( true );
    }
    free_tga(tga);
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromTgaCtx(gdIOCtx* ctx)
{
	int bitmap_caret = 0;
	oTga *tga = NULL;
	/*	int pixel_block_size = 0;
		int image_block_size = 0; */
	volatile gdImagePtr image = NULL;
	int x = 0;
	int y = 0;

	tga = (oTga *) gdMalloc(sizeof(oTga));
	if (!tga) {
		return NULL;
	}

	tga->bitmap = NULL;
	tga->ident = NULL;

	if (read_header_tga(ctx, tga) < 0) {
		free_tga(tga);
		return NULL;
	}

	/*TODO: Will this be used?
		pixel_block_size = tga->bits / 8;
		image_block_size = (tga->width * tga->height) * pixel_block_size;
	*/

	if (read_image_tga(ctx, tga) < 0) {
		free_tga(tga);
		return NULL;
	}

	image = gdImageCreateTrueColor((int)tga->width, (int)tga->height );

	if (image == 0) {
		free_tga( tga );
		return NULL;
	}

	/*!	\brief Populate GD image object
	 *  Copy the pixel data from our tga bitmap buffer into the GD image
	 *  Disable blending and save the alpha channel per default
	 */
	if (tga->alphabits) {
		gdImageAlphaBlending(image, 0);
		gdImageSaveAlpha(image, 1);
	}

	/* TODO: use alphabits as soon as we support 24bit and other alpha bps (ie != 8bits) */
	for (y = 0; y < tga->height; y++) {
		register int *tpix = image->tpixels[y];
		for ( x = 0; x < tga->width; x++, tpix++) {
			if (tga->bits == TGA_BPP_24) {
				*tpix = gdTrueColor(tga->bitmap[bitmap_caret + 2], tga->bitmap[bitmap_caret + 1], tga->bitmap[bitmap_caret]);
				bitmap_caret += 3;
			} else if (tga->bits == TGA_BPP_32 && tga->alphabits) {
				register int a = tga->bitmap[bitmap_caret + 3];

				*tpix = gdTrueColorAlpha(tga->bitmap[bitmap_caret + 2], tga->bitmap[bitmap_caret + 1], tga->bitmap[bitmap_caret], gdAlphaMax - (a >> 1));
				bitmap_caret += 4;
			}
		}
	}

	if (tga->flipv && tga->fliph) {
		gdImageFlipBoth(image);
	} else if (tga->flipv) {
		gdImageFlipVertical(image);
	} else if (tga->fliph) {
		gdImageFlipHorizontal(image);
	}

	free_tga(tga);

	return image;
}